

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_gfx_end(void)

{
  rf_gfx_color_data_type *prVar1;
  rf_gfx_texcoord_data_type *prVar2;
  rf_context *prVar3;
  long lVar4;
  rf_render_batch *prVar5;
  int iVar6;
  long lVar7;
  rf_vertex_buffer *prVar8;
  int iVar9;
  int iVar10;
  
  prVar3 = rf__ctx;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar4 = prVar5->current_buffer;
  prVar8 = prVar5->vertex_buffers;
  iVar6 = prVar8[lVar4].v_counter;
  iVar9 = iVar6 - prVar8[lVar4].c_counter;
  if ((iVar9 != 0) && (0 < iVar9)) {
    lVar7 = (long)iVar9;
    do {
      prVar8[lVar4].colors[(long)prVar8[lVar4].c_counter * 4] =
           prVar8[lVar4].colors[(long)prVar8[lVar4].c_counter * 4 + -4];
      prVar5 = (prVar3->field_0).current_batch;
      lVar4 = prVar5->current_buffer;
      prVar8 = prVar5->vertex_buffers;
      prVar1 = prVar8[lVar4].colors;
      lVar4 = (long)prVar8[lVar4].c_counter;
      prVar1[(long)(int)(lVar4 << 2) + 1] = prVar1[lVar4 * 4 + -3];
      prVar5 = (prVar3->field_0).current_batch;
      lVar4 = prVar5->current_buffer;
      prVar8 = prVar5->vertex_buffers;
      prVar1 = prVar8[lVar4].colors;
      lVar4 = (long)prVar8[lVar4].c_counter;
      prVar1[(long)(int)(lVar4 << 2) + 2] = prVar1[lVar4 * 4 + -2];
      prVar5 = (prVar3->field_0).current_batch;
      lVar4 = prVar5->current_buffer;
      prVar8 = prVar5->vertex_buffers;
      prVar1 = prVar8[lVar4].colors;
      lVar4 = (long)prVar8[lVar4].c_counter;
      prVar1[(long)(int)(lVar4 << 2) + 3] = prVar1[lVar4 * 4 + -1];
      prVar5 = (prVar3->field_0).current_batch;
      lVar4 = prVar5->current_buffer;
      prVar8 = prVar5->vertex_buffers;
      prVar8[lVar4].c_counter = prVar8[lVar4].c_counter + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    iVar6 = prVar8[lVar4].v_counter;
  }
  prVar8 = prVar8 + lVar4;
  iVar9 = prVar8->tc_counter;
  iVar10 = iVar6 - iVar9;
  if ((iVar10 != 0) && (0 < iVar10)) {
    prVar2 = prVar8->texcoords;
    lVar4 = 0;
    do {
      (prVar2 + (long)iVar9 * 2 + lVar4 * 2)[0] = 0.0;
      (prVar2 + (long)iVar9 * 2 + lVar4 * 2)[1] = 0.0;
      lVar4 = lVar4 + 1;
    } while (iVar10 != lVar4);
    prVar8->tc_counter = iVar9 + (int)lVar4;
  }
  prVar5->current_depth = prVar5->current_depth + 5e-05;
  if (iVar6 < prVar8->elements_count * 4 + -4) {
    return;
  }
  lVar4 = (long)(prVar3->field_0).stack_counter;
  if (-1 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      rf_gfx_pop_matrix();
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  rf_gfx_draw();
  return;
}

Assistant:

RF_API void rf_gfx_end()
{
    // Make sure vertex_count is the same for vertices, texcoords, colors and normals
    // NOTE: In OpenGL 1.1, one glColor call can be made for all the subsequent glVertex calls

    // Make sure colors count match vertex count
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter != rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter)
    {
        int add_colors = rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter - rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter;

        for (rf_int i = 0; i < add_colors; i++)
        {
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 4];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 1] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 3];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 2] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 2];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 3] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 1];
            rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter++;
        }
    }

    // Make sure texcoords count match vertex count
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter != rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter)
    {
        int add_tex_coords = rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter - rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter;

        for (rf_int i = 0; i < add_tex_coords; i++)
        {
            rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords[2*rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter] = 0.0f;
            rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords[2*rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter + 1] = 0.0f;
            rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter++;
        }
    }

    // TODO: Make sure normals count match vertex count... if normals support is added in a future... :P

    // NOTE: Depth increment is dependant on rf_gfx_ortho(): z-near and z-far values,
    // as well as depth buffer bit-depth (16bit or 24bit or 32bit)
    // Correct increment formula would be: depthInc = (zfar - znear)/pow(2, bits)
    rf_batch.current_depth += (1.0f/20000.0f);

    // Verify internal buffers limits
    // NOTE: This check is combined with usage of rf_gfx_check_buffer_limit()
    if ((rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter) >= (rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4 - 4))
    {
        // WARNING: If we are between rf_gfx_push_matrix() and rf_gfx_pop_matrix() and we need to force a rf_gfx_draw(),
        // we need to call rf_gfx_pop_matrix() before to recover *rf_ctx->gl_ctx.current_matrix (rf_ctx->gl_ctx.modelview) for the next forced draw call!
        // If we have multiple matrix pushed, it will require "rf_ctx->gl_ctx.stack_counter" pops before launching the draw
        for (rf_int i = rf_ctx.stack_counter; i >= 0; i--) rf_gfx_pop_matrix();
        rf_gfx_draw();
    }
}